

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_wString __thiscall
ON_SubDComponentId::ToString
          (ON_SubDComponentId *this,bool bUnsetIsEmptyString,bool bDirectionPrefix)

{
  uint uVar1;
  Type TVar2;
  bool bVar3;
  uint uVar4;
  char in_CL;
  undefined7 in_register_00000031;
  ON_SubDComponentId *this_00;
  ulong uVar5;
  ON_wString str;
  ON_SubDFaceCornerDex cdex;
  ON_wString OStack_48;
  ON_wString local_40;
  ON_SubDFaceCornerDex local_34;
  
  this_00 = (ON_SubDComponentId *)CONCAT71(in_register_00000031,bUnsetIsEmptyString);
  ON_wString::ON_wString(&local_40);
  uVar1 = this_00->m_id;
  if (uVar1 != 0) {
    uVar5 = 0;
    if (in_CL != '\0') {
      uVar5 = (ulong)((this_00->m_type_and_dir & 1) * 2 + 0x2b);
    }
    TVar2 = ON_SubDComponentPtr::ComponentPtrTypeFromUnsigned(this_00->m_type_and_dir & 6);
    if (TVar2 == Vertex) {
      if (in_CL == '\0') {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"v%u",(ulong)uVar1);
      }
      else {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"%cv%u",uVar5,(ulong)uVar1);
      }
      ON_wString::operator=(&local_40,&OStack_48);
    }
    else if (TVar2 == Edge) {
      if (in_CL == '\0') {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"e%u",(ulong)uVar1);
      }
      else {
        ON_wString::FormatToString((wchar_t *)&OStack_48,L"%ce%u",uVar5,(ulong)uVar1);
      }
      ON_wString::operator=(&local_40,&OStack_48);
    }
    else {
      if (TVar2 != Face) goto LAB_005cff31;
      local_34 = FaceCornerDex(this_00);
      bVar3 = ON_SubDFaceCornerDex::IsSet(&local_34);
      if (bVar3) {
        if (in_CL == '\0') {
          uVar4 = ON_SubDFaceCornerDex::CornerIndex(&local_34);
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"f%u.%u",(ulong)uVar1,(ulong)uVar4);
        }
        else {
          uVar4 = ON_SubDFaceCornerDex::CornerIndex(&local_34);
          ON_wString::FormatToString
                    ((wchar_t *)&OStack_48,L"%cf%u.%u",uVar5,(ulong)uVar1,(ulong)uVar4);
        }
        ON_wString::operator=(&local_40,&OStack_48);
      }
      else {
        if (in_CL == '\0') {
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"f%u",(ulong)uVar1);
        }
        else {
          ON_wString::FormatToString((wchar_t *)&OStack_48,L"%cf%u",uVar5,(ulong)uVar1);
        }
        ON_wString::operator=(&local_40,&OStack_48);
      }
    }
    ON_wString::~ON_wString(&OStack_48);
  }
LAB_005cff31:
  bVar3 = ON_wString::IsNotEmpty(&local_40);
  if (bVar3 || bDirectionPrefix) {
    ON_wString::ON_wString((ON_wString *)this,&local_40);
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,"unset");
  }
  ON_wString::~ON_wString(&local_40);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDComponentId::ToString(bool bUnsetIsEmptyString, bool bDirectionPrefix) const
{
  ON_wString str;
  const unsigned id = this->ComponentId();
  if (id > 0)
  {
    const char prefix = bDirectionPrefix ? (1 == this->ComponentDirection() ? '-' : '+') : 0;
    switch (this->ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      str = (0 == prefix) ? ON_wString::FormatToString(L"v%u", id) : ON_wString::FormatToString(L"%cv%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Edge:
      str = (0 == prefix) ? ON_wString::FormatToString(L"e%u", id) : ON_wString::FormatToString(L"%ce%u", prefix, id);
      break;

    case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFaceCornerDex cdex = this->FaceCornerDex();
      if (cdex.IsSet())
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u.%u", id, cdex.CornerIndex()) : ON_wString::FormatToString(L"%cf%u.%u", prefix, id, cdex.CornerIndex());
      else
        str = (0 == prefix) ? ON_wString::FormatToString(L"f%u", id) : ON_wString::FormatToString(L"%cf%u", prefix, id);
    }
    break;

    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }
  return (str.IsNotEmpty() || bUnsetIsEmptyString) ? str : ON_wString("unset");
}